

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O3

SQBool sqstd_rex_match(SQRex *exp,SQChar *text)

{
  size_t sVar1;
  SQChar *pSVar2;
  SQBool SVar3;
  
  exp->_bol = text;
  sVar1 = strlen(text);
  exp->_eol = text + sVar1;
  exp->_currsubexp = 0;
  SVar3 = 0;
  pSVar2 = sqstd_rex_matchnode(exp,exp->_nodes,text,(SQRexNode *)0x0);
  if (pSVar2 != (SQChar *)0x0) {
    SVar3 = (SQBool)(pSVar2 == exp->_eol);
  }
  return SVar3;
}

Assistant:

SQBool sqstd_rex_match(SQRex* exp,const SQChar* text)
{
    const SQChar* res = NULL;
    exp->_bol = text;
    exp->_eol = text + strlen(text);
    exp->_currsubexp = 0;
    res = sqstd_rex_matchnode(exp,exp->_nodes,text,NULL);
    if(res == NULL || res != exp->_eol)
        return SQFalse;
    return SQTrue;
}